

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::FixNewlines::expandBetween(FixNewlines *this,ArgParams *params)

{
  bool bVar1;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  *in_RDI;
  ArgParam *param;
  iterator __end2;
  iterator __begin2;
  ArgParams *__range2;
  bool first;
  FixNewlines *in_stack_ffffffffffffffb8;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_28 [2];
  byte local_11;
  
  local_11 = 1;
  local_28[0]._M_current =
       (ArgParam *)
       std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::begin
                 ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::end
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
    ::operator*(local_28);
    if ((local_11 & 1) == 0) {
      argParamOpenFodder(in_stack_ffffffffffffffb8,(ArgParam *)0x37338f);
      ensureCleanNewline(&param->idFodder);
    }
    local_11 = 0;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

void expandBetween(ArgParams &params)
    {
        bool first = true;
        for (auto &param : params) {
            if (!first) {
                ensureCleanNewline(argParamOpenFodder(param));
            }
            first = false;
        }
    }